

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Vector3f * phyr::uniformSampleCone(Vector3f *__return_storage_ptr__,Point2f *u,double cosThetaMax)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = cosThetaMax * u->x + (1.0 - u->x);
  dVar1 = 1.0 - dVar4 * dVar4;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar2 = (u->y + u->y) * 3.141592653589793;
  dVar3 = cos(dVar2);
  dVar2 = sin(dVar2);
  __return_storage_ptr__->x = dVar3 * dVar1;
  __return_storage_ptr__->y = dVar2 * dVar1;
  __return_storage_ptr__->z = dVar4;
  return __return_storage_ptr__;
}

Assistant:

Vector3f uniformSampleCone(const Point2f& u, Real cosThetaMax) {
    Real cosTheta = ((Real)1 - u[0]) + u[0] * cosThetaMax;
    Real sinTheta = std::sqrt((Real)1 - cosTheta * cosTheta);
    Real phi = u[1] * 2 * Pi;
    return Vector3f(std::cos(phi) * sinTheta, std::sin(phi) * sinTheta, cosTheta);
}